

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O3

Cut_Cut_t *
Cut_NodeComputeCuts(Cut_Man_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1,int fTriv,
                   int TreeCode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Cut_Cut_t *pCVar5;
  long lVar6;
  Cut_Cut_t *pCVar7;
  Cut_Cut_t **ppCVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  Cut_Params_t *pCVar11;
  void **ppvVar12;
  Vec_Ptr_t *pVVar13;
  Cut_Cut_t *pCVar14;
  long lVar15;
  Cut_Cut_t *pCut1;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  Cut_Cut_t *pHead;
  long local_118;
  ulong local_110;
  Cut_Cut_t *local_108;
  Cut_List_t Super;
  
  uVar18 = (ulong)(uint)Node;
  p->nNodes = p->nNodes + 1;
  p->nNodeCuts = 0;
  if (p->pParams->fRecord != 0) {
    pCVar5 = Cut_NodeReadCutsNew(p,Node0);
    Cut_CutNumberList(pCVar5);
    pCVar5 = Cut_NodeReadCutsNew(p,Node1);
    Cut_CutNumberList(pCVar5);
  }
  iVar3 = clock_gettime(3,(timespec *)&Super);
  if (iVar3 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)Super.pHead[1]),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + (long)Super.pHead[0] * -1000000;
  }
  Super.pHead[1] = (Cut_Cut_t *)0x0;
  Super.pHead[2] = (Cut_Cut_t *)0x0;
  Super.pHead[3] = (Cut_Cut_t *)0x0;
  Super.pHead[4] = (Cut_Cut_t *)0x0;
  Super.pHead[5] = (Cut_Cut_t *)0x0;
  Super.pHead[6] = (Cut_Cut_t *)0x0;
  Super.pHead[7] = (Cut_Cut_t *)0x0;
  Super.pHead[8] = (Cut_Cut_t *)0x0;
  Super.pHead[9] = (Cut_Cut_t *)0x0;
  Super.pHead[10] = (Cut_Cut_t *)0x0;
  Super.pHead[0xb] = (Cut_Cut_t *)0x0;
  Super.pHead[0xc] = (Cut_Cut_t *)0x0;
  lVar19 = 1;
  lVar20 = 2;
  lVar6 = 0xe;
  auVar21._8_4_ = (int)&Super;
  auVar21._0_8_ = &Super;
  auVar21._12_4_ = (int)((ulong)&Super >> 0x20);
  do {
    Super.pHead[lVar6] = (Cut_Cut_t *)(Super.pHead + lVar19);
    Super.pHead[lVar6 + 1] = (Cut_Cut_t *)(lVar20 * 8 + auVar21._8_8_);
    lVar19 = lVar19 + 2;
    lVar20 = lVar20 + 2;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x1a);
  pCVar5 = Cut_NodeReadCutsNew(p,Node0);
  pCVar7 = Cut_NodeReadCutsNew(p,Node1);
  Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,pCVar5,pCVar7,fTriv,TreeCode);
  ppCVar8 = &pHead;
  pHead = (Cut_Cut_t *)0x0;
  lVar6 = 1;
  do {
    if (Super.pHead[lVar6] != (Cut_Cut_t *)0x0) {
      *ppCVar8 = Super.pHead[lVar6];
      ppCVar8 = Super.ppTail[lVar6];
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  *ppCVar8 = (Cut_Cut_t *)0x0;
  pCVar5 = pHead;
  iVar3 = clock_gettime(3,(timespec *)&pHead);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_118 / 1000 + (long)pHead * 1000000;
  }
  p->timeMerge = p->timeMerge + lVar6 + lVar15;
  pCVar11 = p->pParams;
  local_110 = uVar18;
  if (pCVar11->fRecord != 0) {
    if ((Node < 0) || (pVVar10 = p->vNodeStarts, pVVar10->nSize <= Node)) goto LAB_004bc003;
    pVVar10->pArray[(uint)Node] = p->vCutPairs->nSize;
    if (pCVar5 != (Cut_Cut_t *)0x0) {
      local_108 = pCVar5;
      do {
        pVVar10 = p->vCutPairs;
        uVar1 = *(uint *)pCVar5;
        uVar2 = pVVar10->nSize;
        if (uVar2 == pVVar10->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar10->pArray == (int *)0x0) {
              piVar9 = (int *)malloc(0x40);
            }
            else {
              piVar9 = (int *)realloc(pVVar10->pArray,0x40);
            }
            pVVar10->pArray = piVar9;
            if (piVar9 == (int *)0x0) {
LAB_004bbfe4:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar10->nCap = 0x10;
          }
          else {
            if (pVVar10->pArray == (int *)0x0) {
              piVar9 = (int *)malloc((ulong)uVar2 * 8);
            }
            else {
              piVar9 = (int *)realloc(pVVar10->pArray,(ulong)uVar2 * 8);
            }
            pVVar10->pArray = piVar9;
            if (piVar9 == (int *)0x0) goto LAB_004bbfe4;
            pVVar10->nCap = uVar2 * 2;
          }
        }
        else {
          piVar9 = pVVar10->pArray;
        }
        iVar3 = pVVar10->nSize;
        pVVar10->nSize = iVar3 + 1;
        piVar9[iVar3] = uVar1 & 0x7ff | (uVar1 & 0x3ff800) << 5;
        pCVar5 = pCVar5->pNext;
      } while (pCVar5 != (Cut_Cut_t *)0x0);
      pVVar10 = p->vNodeStarts;
      pCVar5 = local_108;
    }
    if (pVVar10->nSize <= (int)local_110) goto LAB_004bc022;
    if (p->vNodeCuts->nSize <= (int)local_110) goto LAB_004bc003;
    p->vNodeCuts->pArray[(uint)Node] = p->vCutPairs->nSize - pVVar10->pArray[(uint)Node];
    pCVar11 = p->pParams;
  }
  pCVar7 = pCVar5;
  if (pCVar5 != (Cut_Cut_t *)0x0 && pCVar11->fRecordAig != 0) {
    do {
      uVar1 = *(uint *)pCVar7;
      if (0x4fffffff < uVar1) {
        Aig_RManRecord((uint *)((long)&pCVar7[1].field_0x0 + (ulong)(uVar1 >> 0x16 & 0x3c)),
                       uVar1 >> 0x1c);
      }
      ppCVar8 = &pCVar7->pNext;
      pCVar7 = *ppCVar8;
    } while (*ppCVar8 != (Cut_Cut_t *)0x0);
    pCVar11 = p->pParams;
  }
  if (p->nNodeCuts == pCVar11->nKeepMax) {
    p->nCutsLimit = p->nCutsLimit + 1;
  }
  pVVar13 = p->vCutsNew;
  iVar3 = pVVar13->nSize;
  iVar4 = (int)local_110;
  if (iVar3 <= iVar4) {
    iVar16 = iVar4 + 1;
    iVar17 = pVVar13->nCap;
    if (iVar4 < iVar17 * 2) {
      if (iVar17 <= iVar4) {
        if (pVVar13->pArray == (void **)0x0) {
          ppvVar12 = (void **)malloc((long)iVar17 << 4);
        }
        else {
          ppvVar12 = (void **)realloc(pVVar13->pArray,(long)iVar17 << 4);
        }
        pVVar13->pArray = ppvVar12;
        iVar3 = iVar17 * 2;
LAB_004bbd1c:
        pVVar13->nCap = iVar3;
        iVar3 = pVVar13->nSize;
      }
    }
    else if (iVar17 <= iVar4) {
      if (pVVar13->pArray == (void **)0x0) {
        ppvVar12 = (void **)malloc((long)iVar16 << 3);
      }
      else {
        ppvVar12 = (void **)realloc(pVVar13->pArray,(long)iVar16 << 3);
      }
      pVVar13->pArray = ppvVar12;
      iVar3 = iVar16;
      goto LAB_004bbd1c;
    }
    if (iVar3 <= (int)local_110) {
      lVar15 = (long)iVar3;
      do {
        pVVar13->pArray[lVar15] = (void *)0x0;
        lVar15 = lVar15 + 1;
      } while (iVar16 != lVar15);
    }
    pVVar13->nSize = iVar16;
  }
  uVar18 = local_110;
  iVar3 = (int)local_110;
  pCVar7 = Cut_NodeReadCutsNew(p,iVar3);
  if (pCVar7 != (Cut_Cut_t *)0x0) {
    __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                  ,0x19b,
                  "Cut_Cut_t *Cut_NodeComputeCuts(Cut_Man_t *, int, int, int, int, int, int, int)");
  }
  Cut_NodeWriteCutsNew(p,iVar3,pCVar5);
  iVar4 = clock_gettime(3,(timespec *)&pHead);
  if (iVar4 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + (long)pHead * -1000000;
  }
  if ((p->pParams->fMap != 0) && (p->pParams->fSeq == 0)) {
    if (-1 < Node0) {
      uVar1 = p->vDelays2->nSize;
      if (((Node0 < (int)uVar1) && (-1 < Node1)) && ((uint)Node1 < uVar1)) {
        piVar9 = p->vDelays2->pArray;
        iVar4 = piVar9[(uint)Node0];
        iVar17 = piVar9[(uint)Node1];
        if (iVar4 == 0) {
          pVVar13 = p->vCutsNew;
        }
        else {
          pVVar13 = p->vCutsMax;
        }
        if (Node0 < pVVar13->nSize) {
          pCVar7 = (Cut_Cut_t *)pVVar13->pArray[(uint)Node0];
          if (iVar17 == 0) {
            pVVar13 = p->vCutsNew;
          }
          else {
            pVVar13 = p->vCutsMax;
          }
          if (Node1 < pVVar13->nSize) {
            pCVar14 = (Cut_Cut_t *)pVVar13->pArray[(uint)Node1];
            if (iVar4 == iVar17) {
              iVar17 = iVar4 + (uint)(iVar4 == 0);
            }
            else {
              pVVar13 = p->vCutsNew;
              if (iVar17 < iVar4) {
                if (pVVar13->nSize <= Node1) goto LAB_004bc060;
                pCVar14 = (Cut_Cut_t *)pVVar13->pArray[(uint)Node1];
                iVar17 = iVar4;
                if (((undefined1  [24])*pCVar14 & (undefined1  [24])0xf0000000) !=
                    (undefined1  [24])0x10000000) {
                  __assert_fail("pCut1->nLeaves == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                                ,0x1f8,
                                "int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
                }
              }
              else {
                if (pVVar13->nSize <= Node0) goto LAB_004bc060;
                pCVar7 = (Cut_Cut_t *)pVVar13->pArray[(uint)Node0];
                if (((undefined1  [24])*pCVar7 & (undefined1  [24])0xf0000000) !=
                    (undefined1  [24])0x10000000) {
                  __assert_fail("pCut0->nLeaves == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                                ,0x1fe,
                                "int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
                }
              }
            }
            pCut1 = pCVar14;
            if (*(uint *)pCVar7 >> 0x1c < *(uint *)pCVar14 >> 0x1c) {
              pCut1 = pCVar7;
              pCVar7 = pCVar14;
            }
            pCVar7 = Cut_CutMergeTwo(p,pCVar7,pCut1);
            if (pCVar7 == (Cut_Cut_t *)0x0) {
              iVar17 = iVar17 + 1;
              pCVar7 = Cut_CutAlloc(p);
              *(uint *)pCVar7 = *(uint *)pCVar7 & 0xfffffff | 0x20000000;
              iVar4 = Node1;
              if ((uint)Node0 < (uint)Node1) {
                iVar4 = Node0;
              }
              *(int *)(pCVar7 + 1) = iVar4;
              if ((uint)Node0 >= (uint)Node1 && Node0 != Node1) {
                Node1 = Node0;
              }
              pCVar7[1].uSign = Node1;
            }
            if (iVar17 < 1) {
              __assert_fail("Delay > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                            ,0x20d,"int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
            }
            if ((iVar3 < 0) || (p->vDelays2->nSize <= iVar3)) {
LAB_004bc003:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p->vDelays2->pArray[uVar18 & 0xffffffff] = iVar17;
            if (p->vCutsMax->nSize <= iVar3) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            p->vCutsMax->pArray[uVar18 & 0xffffffff] = pCVar7;
            if (p->nDelayMin < iVar17) {
              p->nDelayMin = iVar17;
            }
            goto LAB_004bbf80;
          }
        }
LAB_004bc060:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
LAB_004bc022:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_004bbf80:
  iVar3 = clock_gettime(3,(timespec *)&pHead);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_118 / 1000 + (long)pHead * 1000000;
  }
  p->timeMap = p->timeMap + lVar6 + lVar15;
  return pCVar5;
}

Assistant:

Cut_Cut_t * Cut_NodeComputeCuts( Cut_Man_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1, int fTriv, int TreeCode )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pCut;
    abctime clk;
    // start the number of cuts at the node
    p->nNodes++;
    p->nNodeCuts = 0;
    // prepare information for recording
    if ( p->pParams->fRecord )
    {
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node0) );
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node1) );
    }
    // compute the cuts
clk = Abc_Clock();
    Cut_ListStart( pSuper );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, Cut_NodeReadCutsNew(p, Node0), Cut_NodeReadCutsNew(p, Node1), fTriv, TreeCode );
    pList = Cut_ListFinish( pSuper );
p->timeMerge += Abc_Clock() - clk;
    // verify the result of cut computation
//    Cut_CutListVerify( pList );
    // performing the recording
    if ( p->pParams->fRecord )
    {
        Vec_IntWriteEntry( p->vNodeStarts, Node, Vec_IntSize(p->vCutPairs) );
        Cut_ListForEachCut( pList, pCut )
            Vec_IntPush( p->vCutPairs, ((pCut->Num1 << 16) | pCut->Num0) );
        Vec_IntWriteEntry( p->vNodeCuts, Node, Vec_IntSize(p->vCutPairs) - Vec_IntEntry(p->vNodeStarts, Node) );
    }
    if ( p->pParams->fRecordAig )
    {
        extern void Aig_RManRecord( unsigned * pTruth, int nVarsInit );
        Cut_ListForEachCut( pList, pCut )
            if ( Cut_CutReadLeaveNum(pCut) > 4 )
                Aig_RManRecord( Cut_CutReadTruth(pCut), Cut_CutReadLeaveNum(pCut) );
    }
    // check if the node is over the list
    if ( p->nNodeCuts == p->pParams->nKeepMax )
        p->nCutsLimit++;
    // set the list at the node
    Vec_PtrFillExtra( p->vCutsNew, Node + 1, NULL );
    assert( Cut_NodeReadCutsNew(p, Node) == NULL );
    /////
//    pList->pNext = NULL;
    /////
    Cut_NodeWriteCutsNew( p, Node, pList );
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList0 );
//p->timeFilter += Abc_Clock() - clk;
    // perform mapping of this node with these cuts
clk = Abc_Clock();
    if ( p->pParams->fMap && !p->pParams->fSeq )
    {
//        int Delay1, Delay2;
//        Delay1 = Cut_NodeMapping( p, pList, Node, Node0, Node1 );    
//        Delay2 = Cut_NodeMapping2( p, pList, Node, Node0, Node1 );   
//        assert( Delay1 >= Delay2 );
        Cut_NodeMapping( p, pList, Node, Node0, Node1 );
    }
p->timeMap += Abc_Clock() - clk;
    return pList;
}